

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_divVecScalar_vec4(ShaderEvalContext *c)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  auVar3 = *(undefined1 (*) [16])c->in[0].m_data;
  fVar1 = c->in[1].m_data[0];
  auVar2._0_12_ = auVar3._4_12_;
  auVar2._12_4_ = auVar3._0_4_;
  auVar3._4_4_ = fVar1;
  auVar3._0_4_ = fVar1;
  auVar3._8_4_ = fVar1;
  auVar3._12_4_ = fVar1;
  auVar3 = divps(auVar2,auVar3);
  *(undefined1 (*) [16])(c->color).m_data = auVar3;
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }